

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::fatal<char_const(&)[52],ktx::SelectorRange&>
          (Reporter *this,ReturnCode return_code,char (*args) [52],SelectorRange *args_1)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined8 in_RDX;
  undefined8 in_RDI;
  ReturnCode returnCode;
  FatalError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  basic_string_view<char> in_stack_ffffffffffffff38;
  undefined8 local_b8;
  size_t local_b0;
  char *local_a8 [3];
  undefined8 local_90;
  char *local_78;
  FatalError *local_70;
  char *local_68;
  FatalError *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  char *local_40;
  undefined1 *local_38;
  char *local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 *local_10;
  undefined8 local_8;
  
  returnCode = (ReturnCode)((ulong)in_RDI >> 0x20);
  this_00 = (FatalError *)local_a8;
  local_78 = "{} fatal: ";
  local_68 = "{} fatal: ";
  local_a8[0] = "{} fatal: ";
  local_90 = in_RDX;
  local_70 = this_00;
  local_60 = this_00;
  sVar1 = std::char_traits<char>::length((char_type *)0x276c8d);
  *(size_t *)&this_00->returnCode = sVar1;
  local_58 = local_78;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff30,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff28);
  local_20 = &local_b8;
  local_28 = local_90;
  local_18 = local_90;
  local_b8 = local_90;
  local_10 = local_20;
  local_b0 = std::char_traits<char>::length((char_type *)0x276d27);
  local_8 = local_28;
  ::fmt::v10::print<ktx::SelectorRange&>
            (in_stack_ffffffffffffff30,
             (format_string<ktx::SelectorRange_&>)in_stack_ffffffffffffff38,
             (SelectorRange *)in_stack_ffffffffffffff28);
  local_48 = &stack0xffffffffffffff38;
  local_50 = "\n";
  local_40 = "\n";
  local_38 = local_48;
  sVar1 = std::char_traits<char>::length((char_type *)0x276dbd);
  local_30 = local_50;
  ::fmt::v10::print<>(in_stack_ffffffffffffff30,(format_string<>)in_stack_ffffffffffffff38);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(this_00,returnCode);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal(ReturnCode return_code, Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, "\n");
        throw FatalError(return_code);
    }